

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Reference::MutateInt(Reference *this,int64_t i)

{
  byte bVar1;
  BitWidth BVar2;
  uint8_t *puVar3;
  uint64_t u_1;
  uint64_t u;
  int64_t i_local;
  Reference *this_local;
  
  if (this->type_ == FBT_INT) {
    puVar3 = this->data_;
    bVar1 = this->parent_width_;
    BVar2 = WidthI(i);
    this_local._7_1_ = Mutate<long>(this,puVar3,i,(ulong)bVar1,BVar2);
  }
  else if (this->type_ == FBT_INDIRECT_INT) {
    puVar3 = Indirect(this);
    bVar1 = this->byte_width_;
    BVar2 = WidthI(i);
    this_local._7_1_ = Mutate<long>(this,puVar3,i,(ulong)bVar1,BVar2);
  }
  else if (this->type_ == FBT_UINT) {
    puVar3 = this->data_;
    bVar1 = this->parent_width_;
    BVar2 = WidthU(i);
    this_local._7_1_ = Mutate<unsigned_long>(this,puVar3,i,(ulong)bVar1,BVar2);
  }
  else if (this->type_ == FBT_INDIRECT_UINT) {
    puVar3 = Indirect(this);
    bVar1 = this->byte_width_;
    BVar2 = WidthU(i);
    this_local._7_1_ = Mutate<unsigned_long>(this,puVar3,i,(ulong)bVar1,BVar2);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MutateInt(int64_t i) {
    if (type_ == FBT_INT) {
      return Mutate(data_, i, parent_width_, WidthI(i));
    } else if (type_ == FBT_INDIRECT_INT) {
      return Mutate(Indirect(), i, byte_width_, WidthI(i));
    } else if (type_ == FBT_UINT) {
      auto u = static_cast<uint64_t>(i);
      return Mutate(data_, u, parent_width_, WidthU(u));
    } else if (type_ == FBT_INDIRECT_UINT) {
      auto u = static_cast<uint64_t>(i);
      return Mutate(Indirect(), u, byte_width_, WidthU(u));
    } else {
      return false;
    }
  }